

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

uint8_t __thiscall AmpIO::GetEncoderChannelA(AmpIO *this)

{
  uint32_t uVar1;
  uint i;
  ulong uVar2;
  byte bVar3;
  
  uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar1 == 0x44514c41) {
    bVar3 = 0;
    for (uVar2 = 0; this->NumEncoders != uVar2; uVar2 = uVar2 + 1) {
      bVar3 = (byte)(1 << ((byte)uVar2 & 0x1f)) &
              (char)(*(char *)((long)this->ReadBuffer +
                              (ulong)(this->ENC_POS_OFFSET + (int)uVar2) * 4 + 3) << 3) >> 7 | bVar3
      ;
    }
  }
  else {
    bVar3 = *(byte *)((long)this->ReadBuffer + 0xb) & 0xf;
  }
  return bVar3;
}

Assistant:

uint8_t AmpIO::GetEncoderChannelA(void) const
{
    uint8_t encA;
    if (GetHardwareVersion() == DQLA_String) {
        // This also works for QLA with Rev 8+
        encA = 0;
        for (unsigned int i = 0; i < NumEncoders; i++) {
            if (ReadBuffer[ENC_POS_OFFSET+i]&ENC_A_MASK)
                encA |= (1 << i);
        }
    }
    else {
        encA =  static_cast<uint8_t>((this->GetDigitalInput()&0x0f000000)>>24);
    }
 return encA;
}